

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grid.cpp
# Opt level: O1

void sdf_tools::exportGrid(module *m)

{
  PyObject *pPVar1;
  _Head_base<0UL,_pybind11::detail::function_record_*,_false> _Var2;
  class_<sdf_tools::Grid> *pcVar3;
  handle hVar4;
  cpp_function cf;
  handle local_e8;
  undefined8 local_e0;
  _Head_base<0UL,_pybind11::detail::function_record_*,_false> local_d8;
  undefined8 local_d0;
  arg local_c8;
  class_<sdf_tools::Grid> local_b8;
  char *local_b0;
  undefined1 local_a8;
  code *local_a0;
  undefined8 local_98;
  code *local_90;
  undefined8 local_88;
  arg local_80;
  arg local_70;
  arg local_60;
  arg local_50;
  arg local_40;
  
  pybind11::class_<sdf_tools::Grid>::class_<char[47]>
            (&local_b8,(m->super_object).super_handle.m_ptr,"Uniform",
             (char (*) [47])"\n        container to hold SDF grid data\n\n    ");
  local_40.name = "dimensions";
  local_40._8_1_ = 2;
  local_50.name = "offsets";
  local_50._8_1_ = 2;
  local_60.name = "extents";
  local_60._8_1_ = 2;
  pybind11::class_<sdf_tools::Grid>::
  def<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_amlucas[P]sdfTools_src_extern_pybind11_include_pybind11_detail_init_h:174:28),_pybind11::detail::is_new_style_constructor,_pybind11::arg,_pybind11::arg,_pybind11::arg,_char[242]>
            (&local_b8,"__init__",(type *)&local_90,(is_new_style_constructor *)&local_a0,&local_40,
             &local_50,&local_60,
             (char (*) [242])
             "\n            Create an empty uniform grid of given size.\n\n            Args:\n                dimensions: Number of cells along each dimension.\n                offsets: Start of the domain.\n                extents: Size of the domain.\n        "
            );
  local_90 = Grid::getData;
  local_88 = 0;
  pcVar3 = pybind11::class_<sdf_tools::Grid>::
           def<std::vector<float,std::allocator<float>>&(sdf_tools::Grid::*)(),char[71]>
                     (&local_b8,"get",(offset_in_Grid_to_subr *)&local_90,
                      (char (*) [71])
                      "\n            Returns a list of all values in a flatten array.\n        ");
  local_a0 = Grid::getData;
  local_98 = 0;
  pcVar3 = pybind11::class_<sdf_tools::Grid>::
           def<std::vector<float,std::allocator<float>>const&(sdf_tools::Grid::*)()const,char[79]>
                     (pcVar3,"get",(offset_in_Grid_to_subr *)&local_a0,
                      (char (*) [79])
                      "\n            Returns a list of all values in a flatten array (const).\n        "
                     );
  local_b0 = "name";
  local_a8 = 2;
  pPVar1 = (pcVar3->super_generic_type).super_object.super_handle.m_ptr;
  local_c8.name = &_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  local_e8.m_ptr = (PyObject *)PyObject_GetAttrString(pPVar1,"dump");
  if (local_e8.m_ptr == (PyObject *)0x0) {
    PyErr_Clear();
    local_e8.m_ptr = (PyObject *)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
  }
  hVar4.m_ptr = local_e8.m_ptr;
  cf.super_function.super_object.super_handle.m_ptr = (function)(object)0x0;
  pybind11::cpp_function::make_function_record((cpp_function *)&local_d8);
  _Var2._M_head_impl = local_d8._M_head_impl;
  (local_d8._M_head_impl)->impl =
       pybind11::cpp_function::
       initialize<sdf_tools::exportGrid(pybind11::module_&)::$_0,void,sdf_tools::Grid_const*,std::__cxx11::string,pybind11::name,pybind11::is_method,pybind11::sibling,pybind11::arg,char[177]>(sdf_tools::exportGrid(pybind11::module_&)::$_0&&,void(*)(sdf_tools::Grid_const*,std::__cxx11::string),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&,pybind11::arg_const&,char_const(&)[177])
       ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
  (local_d8._M_head_impl)->name = "dump";
  (local_d8._M_head_impl)->field_0x59 = (local_d8._M_head_impl)->field_0x59 | 0x10;
  ((local_d8._M_head_impl)->scope).m_ptr = pPVar1;
  ((local_d8._M_head_impl)->sibling).m_ptr = hVar4.m_ptr;
  pybind11::detail::process_attribute<pybind11::arg,_void>::init
            ((process_attribute<pybind11::arg,_void> *)&local_b0,
             (EVP_PKEY_CTX *)local_d8._M_head_impl);
  (_Var2._M_head_impl)->doc =
       "\n          Dump the data to a file.\n          Supported format: .bov, .vtk, .sdf\n\n          Args:\n              name: Filename (with the desired extension) to dump to.\n        "
  ;
  pybind11::cpp_function::initialize_generic
            (&cf,(unique_function_record *)&local_d8,"({%}, {str}) -> None",
             (type_info **)
             pybind11::cpp_function::
             initialize<sdf_tools::exportGrid(pybind11::module_&)::$_0,void,sdf_tools::Grid_const*,std::__cxx11::string,pybind11::name,pybind11::is_method,pybind11::sibling,pybind11::arg,char[177]>(sdf_tools::exportGrid(pybind11::module_&)::$_0&&,void(*)(sdf_tools::Grid_const*,std::__cxx11::string),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&,pybind11::arg_const&,char_const&[])
             ::types,2);
  std::
  unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ::~unique_ptr((unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                 *)&local_d8);
  pybind11::object::~object((object *)&local_e8);
  pybind11::object::~object((object *)&local_c8);
  pybind11::detail::add_class_method((object *)pcVar3,"dump",&cf);
  pybind11::object::~object((object *)&cf);
  pPVar1 = (pcVar3->super_generic_type).super_object.super_handle.m_ptr;
  local_c8.name = &_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  hVar4.m_ptr = (PyObject *)PyObject_GetAttrString(pPVar1,"evaluate_sdf");
  if (hVar4.m_ptr == (PyObject *)0x0) {
    PyErr_Clear();
    local_e8.m_ptr = (PyObject *)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
    hVar4.m_ptr = local_e8.m_ptr;
  }
  local_e8.m_ptr = hVar4.m_ptr;
  hVar4.m_ptr = local_e8.m_ptr;
  cf.super_function.super_object.super_handle.m_ptr = (function)(object)0x0;
  pybind11::cpp_function::make_function_record((cpp_function *)&local_d8);
  (local_d8._M_head_impl)->impl =
       pybind11::cpp_function::
       initialize<sdf_tools::exportGrid(pybind11::module_&)::$_1,void,sdf_tools::Grid*,sdf_tools::sdf::Sdf_const*,pybind11::name,pybind11::is_method,pybind11::sibling>(sdf_tools::exportGrid(pybind11::module_&)::$_1&&,void(*)(sdf_tools::Grid*,sdf_tools::sdf::Sdf_const*),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&)
       ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
  (local_d8._M_head_impl)->name = "evaluate_sdf";
  (local_d8._M_head_impl)->field_0x59 = (local_d8._M_head_impl)->field_0x59 | 0x10;
  ((local_d8._M_head_impl)->scope).m_ptr = pPVar1;
  ((local_d8._M_head_impl)->sibling).m_ptr = hVar4.m_ptr;
  pybind11::cpp_function::initialize_generic
            (&cf,(unique_function_record *)&local_d8,"({%}, {%}) -> None",
             (type_info **)
             pybind11::cpp_function::
             initialize<sdf_tools::exportGrid(pybind11::module_&)::$_1,void,sdf_tools::Grid*,sdf_tools::sdf::Sdf_const*,pybind11::name,pybind11::is_method,pybind11::sibling>(sdf_tools::exportGrid(pybind11::module_&)::$_1&&,void(*)(sdf_tools::Grid*,sdf_tools::sdf::Sdf_const*),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&)
             ::types,2);
  std::
  unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ::~unique_ptr((unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                 *)&local_d8);
  pybind11::object::~object((object *)&local_e8);
  pybind11::object::~object((object *)&local_c8);
  pybind11::detail::add_class_method((object *)pcVar3,"evaluate_sdf",&cf);
  pybind11::object::~object((object *)&cf);
  pPVar1 = (pcVar3->super_generic_type).super_object.super_handle.m_ptr;
  local_c8.name = &_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  hVar4.m_ptr = (PyObject *)PyObject_GetAttrString(pPVar1,"evaluate_sdf_periodic");
  if (hVar4.m_ptr == (PyObject *)0x0) {
    PyErr_Clear();
    local_e8.m_ptr = (PyObject *)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
    hVar4.m_ptr = local_e8.m_ptr;
  }
  local_e8.m_ptr = hVar4.m_ptr;
  hVar4.m_ptr = local_e8.m_ptr;
  cf.super_function.super_object.super_handle.m_ptr = (function)(object)0x0;
  pybind11::cpp_function::make_function_record((cpp_function *)&local_d8);
  (local_d8._M_head_impl)->impl =
       pybind11::cpp_function::
       initialize<sdf_tools::exportGrid(pybind11::module_&)::$_2,void,sdf_tools::Grid*,sdf_tools::sdf::Sdf_const*,pybind11::name,pybind11::is_method,pybind11::sibling>(sdf_tools::exportGrid(pybind11::module_&)::$_2&&,void(*)(sdf_tools::Grid*,sdf_tools::sdf::Sdf_const*),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&)
       ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
  (local_d8._M_head_impl)->name = "evaluate_sdf_periodic";
  (local_d8._M_head_impl)->field_0x59 = (local_d8._M_head_impl)->field_0x59 | 0x10;
  ((local_d8._M_head_impl)->scope).m_ptr = pPVar1;
  ((local_d8._M_head_impl)->sibling).m_ptr = hVar4.m_ptr;
  pybind11::cpp_function::initialize_generic
            (&cf,(unique_function_record *)&local_d8,"({%}, {%}) -> None",
             (type_info **)
             pybind11::cpp_function::
             initialize<sdf_tools::exportGrid(pybind11::module_&)::$_2,void,sdf_tools::Grid*,sdf_tools::sdf::Sdf_const*,pybind11::name,pybind11::is_method,pybind11::sibling>(sdf_tools::exportGrid(pybind11::module_&)::$_2&&,void(*)(sdf_tools::Grid*,sdf_tools::sdf::Sdf_const*),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&)
             ::types,2);
  std::
  unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ::~unique_ptr((unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                 *)&local_d8);
  pybind11::object::~object((object *)&local_e8);
  pybind11::object::~object((object *)&local_c8);
  pybind11::detail::add_class_method((object *)pcVar3,"evaluate_sdf_periodic",&cf);
  pybind11::object::~object((object *)&cf);
  local_d8._M_head_impl = (function_record *)Grid::flip;
  local_d0 = 0;
  cf.super_function.super_object.super_handle.m_ptr = (function)anon_var_dwarf_c0954;
  pcVar3 = pybind11::class_<sdf_tools::Grid>::
           def<void(sdf_tools::Grid::*)(std::__cxx11::string_const&),pybind11::arg,char[291]>
                     (pcVar3,"flip",(offset_in_Grid_to_subr *)&local_d8,(arg *)&cf,
                      (char (*) [291])
                      "\n          Flip axes of the grid according to map.\n\n          Args:\n              map: The flip map description.\n\n          examples:\n              * map = \'xyz\' does not flip anything\n              * map = \'yxz\' flip x and y axes\n              * map = \'zxy\' z -> x, y -> z, x -> y\n        "
                     );
  local_e8.m_ptr = (PyObject *)Grid::extrude;
  local_e0 = 0;
  local_c8.name = "zoffset";
  local_c8._8_1_ = 2;
  local_70.name = "zextent";
  local_70._8_1_ = 2;
  local_80.name = "nz";
  local_80._8_1_ = 2;
  pybind11::class_<sdf_tools::Grid>::
  def<void(sdf_tools::Grid::*)(float,float,int),pybind11::arg,pybind11::arg,pybind11::arg,char[235]>
            (pcVar3,"extrude",(offset_in_Grid_to_subr *)&local_e8,&local_c8,&local_70,&local_80,
             (char (*) [235])
             "\n          Extrude a SDF from \'xy\' plane to 3 dimensions.\n\n          Args:\n              zoffset: Offset in the new direction.\n              zextent: Extent in the new direction.\n              nz: Resolution in new direction.\n        "
            );
  pybind11::object::~object((object *)&local_b8);
  return;
}

Assistant:

void exportGrid(py::module& m)
{
    py::class_<Grid> (m, "Uniform", R"(
        container to hold SDF grid data

    )")
        .def(py::init <int3, real3, real3> (),
             "dimensions"_a, "offsets"_a, "extents"_a, R"(
            Create an empty uniform grid of given size.

            Args:
                dimensions: Number of cells along each dimension.
                offsets: Start of the domain.
                extents: Size of the domain.
        )")

        .def("get", (std::vector<real>& (Grid::*)()) &Grid::getData, R"(
            Returns a list of all values in a flatten array.
        )")
        .def("get", (const std::vector<real>& (Grid::*)() const) &Grid::getData, R"(
            Returns a list of all values in a flatten array (const).
        )")

        .def("dump", [](const Grid *g, std::string name) {io::dumpGrid(std::move(name), g);},
          "name"_a, R"(
          Dump the data to a file.
          Supported format: .bov, .vtk, .sdf

          Args:
              name: Filename (with the desired extension) to dump to.
        )")

        .def("evaluate_sdf", [](Grid *grid, const sdf::Sdf *sdf) {evaluateAtGridPoints(sdf, grid);})
        .def("evaluate_sdf_periodic", [](Grid *grid, const sdf::Sdf *sdf) {evaluateAtGridPointsPeriodic(sdf, grid);})

        .def("flip", &Grid::flip,
             "map"_a, R"(
          Flip axes of the grid according to map.

          Args:
              map: The flip map description.

          examples:
              * map = 'xyz' does not flip anything
              * map = 'yxz' flip x and y axes
              * map = 'zxy' z -> x, y -> z, x -> y
        )")
        .def("extrude", &Grid::extrude,
             "zoffset"_a, "zextent"_a, "nz"_a, R"(
          Extrude a SDF from 'xy' plane to 3 dimensions.

          Args:
              zoffset: Offset in the new direction.
              zextent: Extent in the new direction.
              nz: Resolution in new direction.
        )");
}